

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O3

bool nite::keyboardReleased(uint key)

{
  bool bVar1;
  bool *pbVar2;
  bool *pbVar3;
  
  if (100 < key) {
    return false;
  }
  if (isKeysStateReleased[key] == false) {
    bVar1 = KeysState[key];
    pbVar3 = KeysStateReleased + key;
    pbVar2 = pbVar3;
    if (bVar1 == false) {
      if (*pbVar3 != true) {
        return false;
      }
      pbVar2 = isKeysStateReleased + key;
      *pbVar3 = false;
    }
    *pbVar2 = true;
    return (bool)(bVar1 ^ 1);
  }
  return true;
}

Assistant:

bool nite::keyboardReleased(unsigned key){
	if (key >= niteKeysn){
		return 0;
	}

	if (isKeysStateReleased[key]){
		return 1;
	}

	if (KeysState[key]){
		KeysStateReleased[key] = 1;
		return 0;
	}

	if (!KeysState[key] and KeysStateReleased[key]){
		KeysStateReleased[key] = 0;
		isKeysStateReleased[key] = 1;
		return 1;
	}

	return 0;
}